

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoMemoryCopy(Thread *this,Instr instr,Ptr *out_trap)

{
  Store *store;
  Result RVar1;
  u64 size;
  u64 src_offset;
  u64 dst_offset;
  RunResult RVar2;
  allocator local_99;
  Ptr mem_src;
  Ptr mem_dst;
  Ptr local_68;
  string local_50;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&mem_dst,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  RefPtr<wabt::interp::Memory>::RefPtr
            (&mem_src,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32x2.snd].index);
  size = PopPtr(this,&mem_src);
  src_offset = PopPtr(this,&mem_src);
  dst_offset = PopPtr(this,&mem_dst);
  RVar1 = Memory::Copy(mem_dst.obj_,dst_offset,mem_src.obj_,src_offset,size);
  RVar2 = Ok;
  if (RVar1.enum_ == Error) {
    store = this->store_;
    std::__cxx11::string::string
              ((string *)&local_50,"out of bounds memory access: memory.copy out of bound",&local_99
              );
    Trap::New(&local_68,store,&local_50,&this->frames_);
    out_trap->obj_ = local_68.obj_;
    out_trap->store_ = local_68.store_;
    out_trap->root_index_ = local_68.root_index_;
    local_68.obj_ = (Trap *)0x0;
    local_68.store_ = (Store *)0x0;
    local_68.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset(&local_68);
    std::__cxx11::string::_M_dispose();
    RVar2 = Trap;
  }
  RefPtr<wabt::interp::Memory>::reset(&mem_src);
  RefPtr<wabt::interp::Memory>::reset(&mem_dst);
  return RVar2;
}

Assistant:

RunResult Thread::DoMemoryCopy(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr mem_dst{store_, inst_->memories()[instr.imm_u32x2.fst]};
  Memory::Ptr mem_src{store_, inst_->memories()[instr.imm_u32x2.snd]};
  auto size = PopPtr(mem_src);
  auto src = PopPtr(mem_src);
  auto dst = PopPtr(mem_dst);
  // TODO: change to "out of bounds"
  TRAP_IF(Failed(Memory::Copy(*mem_dst, dst, *mem_src, src, size)),
          "out of bounds memory access: memory.copy out of bound");
  return RunResult::Ok;
}